

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_huge_timeout(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_timer_t *puVar2;
  uv_loop_t *puVar3;
  uv_loop_t *unaff_RBX;
  uv_timer_t uStack_c0;
  uv_loop_t *puStack_28;
  code *pcStack_20;
  uv_loop_t *puStack_18;
  code *pcStack_10;
  
  pcStack_10 = (code *)0x174e11;
  puVar2 = (uv_timer_t *)uv_default_loop();
  pcStack_10 = (code *)0x174e20;
  iVar1 = uv_timer_init((uv_loop_t *)puVar2,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_10 = (code *)0x174e2d;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x174e3c;
    iVar1 = uv_timer_init((uv_loop_t *)puVar2,&huge_timer1);
    if (iVar1 != 0) goto LAB_00174f15;
    pcStack_10 = (code *)0x174e49;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x174e58;
    iVar1 = uv_timer_init((uv_loop_t *)puVar2,&huge_timer2);
    if (iVar1 != 0) goto LAB_00174f1a;
    puVar2 = &tiny_timer;
    pcStack_10 = (code *)0x174e7a;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00174f1f;
    puVar2 = &huge_timer1;
    pcStack_10 = (code *)0x174ea1;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00174f24;
    puVar2 = &huge_timer2;
    pcStack_10 = (code *)0x174ec1;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00174f29;
    pcStack_10 = (code *)0x174eca;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x174ed4;
    iVar1 = uv_run((uv_loop_t *)puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00174f2e;
    pcStack_10 = (code *)0x174edd;
    unaff_RBX = uv_default_loop();
    pcStack_10 = (code *)0x174ef1;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_10 = (code *)0x174efb;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_10 = (code *)0x174f00;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_10 = (code *)0x174f08;
    iVar1 = uv_loop_close((uv_loop_t *)puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_10 = (code *)0x174f15;
    run_test_timer_huge_timeout_cold_1();
LAB_00174f15:
    pcStack_10 = (code *)0x174f1a;
    run_test_timer_huge_timeout_cold_2();
LAB_00174f1a:
    pcStack_10 = (code *)0x174f1f;
    run_test_timer_huge_timeout_cold_3();
LAB_00174f1f:
    pcStack_10 = (code *)0x174f24;
    run_test_timer_huge_timeout_cold_4();
LAB_00174f24:
    pcStack_10 = (code *)0x174f29;
    run_test_timer_huge_timeout_cold_5();
LAB_00174f29:
    pcStack_10 = (code *)0x174f2e;
    run_test_timer_huge_timeout_cold_6();
LAB_00174f2e:
    pcStack_10 = (code *)0x174f33;
    run_test_timer_huge_timeout_cold_7();
  }
  pcStack_10 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_8();
  if (puVar2 == &tiny_timer) {
    puStack_18 = (uv_loop_t *)0x174f53;
    uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
    puStack_18 = (uv_loop_t *)0x174f61;
    uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
    uv_close((uv_handle_t *)&huge_timer2,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  puStack_18 = (uv_loop_t *)run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_20 = (code *)0x174f7b;
  puStack_18 = unaff_RBX;
  puVar2 = (uv_timer_t *)uv_default_loop();
  pcStack_20 = (code *)0x174f8a;
  iVar1 = uv_timer_init((uv_loop_t *)puVar2,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_20 = (code *)0x174f97;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x174fa6;
    iVar1 = uv_timer_init((uv_loop_t *)puVar2,&huge_timer1);
    if (iVar1 != 0) goto LAB_00175042;
    puVar2 = &tiny_timer;
    pcStack_20 = (code *)0x174fcb;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_00175047;
    puVar2 = &huge_timer1;
    pcStack_20 = (code *)0x174fee;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_0017504c;
    pcStack_20 = (code *)0x174ff7;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x175001;
    iVar1 = uv_run((uv_loop_t *)puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00175051;
    pcStack_20 = (code *)0x17500a;
    unaff_RBX = uv_default_loop();
    pcStack_20 = (code *)0x17501e;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    pcStack_20 = (code *)0x175028;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    pcStack_20 = (code *)0x17502d;
    puVar2 = (uv_timer_t *)uv_default_loop();
    pcStack_20 = (code *)0x175035;
    iVar1 = uv_loop_close((uv_loop_t *)puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_20 = (code *)0x175042;
    run_test_timer_huge_repeat_cold_1();
LAB_00175042:
    pcStack_20 = (code *)0x175047;
    run_test_timer_huge_repeat_cold_2();
LAB_00175047:
    pcStack_20 = (code *)0x17504c;
    run_test_timer_huge_repeat_cold_3();
LAB_0017504c:
    pcStack_20 = (code *)0x175051;
    run_test_timer_huge_repeat_cold_4();
LAB_00175051:
    pcStack_20 = (code *)0x175056;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_20 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  if (huge_repeat_cb::ncalls == 0) {
    if (puVar2 == &huge_timer1) {
      huge_repeat_cb::ncalls = 1;
      return extraout_EAX_00;
    }
  }
  else {
    if (puVar2 == &tiny_timer) {
      huge_repeat_cb::ncalls = huge_repeat_cb::ncalls + 1;
      if (huge_repeat_cb::ncalls != 10) {
        return extraout_EAX_00;
      }
      puStack_28 = (uv_loop_t *)0x17508d;
      uv_close((uv_handle_t *)&tiny_timer,(uv_close_cb)0x0);
      uv_close((uv_handle_t *)&huge_timer1,(uv_close_cb)0x0);
      return extraout_EAX_01;
    }
    puStack_28 = (uv_loop_t *)0x1750b9;
    huge_repeat_cb_cold_1();
  }
  puStack_28 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_28 = unaff_RBX;
  puVar3 = uv_default_loop();
  iVar1 = uv_timer_init(puVar3,&uStack_c0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(&uStack_c0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001751cd;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001751d2;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001751d7;
    iVar1 = uv_timer_start(&uStack_c0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001751dc;
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_ONCE);
    if (iVar1 != 0) goto LAB_001751e1;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001751e6;
    uv_close((uv_handle_t *)&uStack_c0,(uv_close_cb)0x0);
    puVar3 = uv_default_loop();
    iVar1 = uv_run(puVar3,UV_RUN_ONCE);
    if (iVar1 == 0) {
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      puVar3 = uv_default_loop();
      iVar1 = uv_loop_close(puVar3);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001751f0;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001751cd:
    run_test_timer_run_once_cold_2();
LAB_001751d2:
    run_test_timer_run_once_cold_3();
LAB_001751d7:
    run_test_timer_run_once_cold_4();
LAB_001751dc:
    run_test_timer_run_once_cold_5();
LAB_001751e1:
    run_test_timer_run_once_cold_6();
LAB_001751e6:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001751f0:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(timer_huge_timeout) {
  ASSERT(0 == uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT(0 == uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT(0 == uv_timer_init(uv_default_loop(), &huge_timer2));
  ASSERT(0 == uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0));
  ASSERT(0 == uv_timer_start(&huge_timer1, tiny_timer_cb, 0xffffffffffffLL, 0));
  ASSERT(0 == uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY();
  return 0;
}